

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

String * __thiscall
doctest::detail::stringifyBinaryExpr<std::optional<int>,int>
          (String *__return_storage_ptr__,detail *this,optional<int> *lhs,char *op,int *rhs)

{
  size_t sVar1;
  anon_union_24_2_13149d16_for_String_2 local_88;
  anon_union_24_2_13149d16_for_String_2 local_70;
  anon_union_24_2_13149d16_for_String_2 local_58;
  anon_union_24_2_13149d16_for_String_2 local_40;
  
  local_40._0_4_ = 0x7d3f7b;
  local_40.buf[0x17] = '\x14';
  sVar1 = strlen((char *)lhs);
  String::String((String *)&local_58.data,(char *)lhs,(uint)sVar1);
  operator+((String *)&local_70.data,(String *)&local_40.data,(String *)&local_58.data);
  doctest::toString((String *)&local_88.data,*(int *)op);
  operator+(__return_storage_ptr__,(String *)&local_70.data,(String *)&local_88.data);
  if ((local_88.buf[0x17] < '\0') && (local_88.data.ptr != (char *)0x0)) {
    operator_delete__(local_88.data.ptr);
  }
  if ((local_70.buf[0x17] < '\0') && (local_70.data.ptr != (char *)0x0)) {
    operator_delete__(local_70.data.ptr);
  }
  if ((local_58.buf[0x17] < '\0') && (local_58.data.ptr != (char *)0x0)) {
    operator_delete__(local_58.data.ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        // NOLINTNEXTLINE(clang-analyzer-cplusplus.NewDeleteLeaks)
        return toString(lhs) + op + toString(rhs);
    }